

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O3

OPJ_BOOL opj_t2_decode_packets
                   (opj_tcd_t *tcd,opj_t2_t *p_t2,OPJ_UINT32 p_tile_no,opj_tcd_tile_t *p_tile,
                   OPJ_BYTE *p_src,OPJ_UINT32 *p_data_read,OPJ_UINT32 p_max_len,
                   opj_codestream_index_t *p_cstr_index,opj_event_mgr_t *p_manager)

{
  opj_tcp_t *poVar1;
  OPJ_INT32 *pOVar2;
  long lVar3;
  opj_tcd_precinct_t *poVar4;
  opj_image_t *poVar5;
  OPJ_BOOL OVar6;
  uint uVar7;
  opj_pi_iterator_t *poVar8;
  void *__s;
  ulong uVar9;
  OPJ_BYTE *pOVar10;
  opj_tcd_seg_data_chunk_t *ptr;
  OPJ_UINT32 OVar11;
  uint uVar12;
  opj_tcd_band_t *poVar13;
  ulong uVar14;
  int iVar15;
  OPJ_BYTE *pOVar16;
  OPJ_UINT32 OVar17;
  uint uVar18;
  opj_tcd_tile_t *p_tile_00;
  OPJ_UINT32 OVar19;
  OPJ_UINT32 OVar20;
  OPJ_UINT32 OVar21;
  int iVar22;
  opj_tcd_resolution_t *poVar23;
  OPJ_BYTE *pOVar24;
  opj_tcd_cblk_dec_t *poVar25;
  OPJ_UINT32 OVar26;
  ulong uVar27;
  opj_tcd_seg_t *poVar28;
  uint uVar29;
  long *plVar30;
  opj_tcd_tile_t *poVar31;
  bool bVar32;
  bool bVar33;
  opj_event_mgr_t *p_manager_00;
  OPJ_UINT32 local_d8;
  OPJ_UINT32 local_d4;
  opj_pi_iterator_t *local_d0;
  OPJ_BOOL l_read_data;
  ulong local_c0;
  opj_pi_iterator_t *local_b8;
  opj_tcd_tile_t *local_b0;
  void *local_a8;
  OPJ_BYTE *local_a0;
  opj_tcp_t *local_98;
  ulong local_90;
  opj_image_t *local_88;
  ulong local_80;
  long local_78;
  uint local_70;
  uint local_6c;
  opj_t2_t *local_68;
  opj_tcd_band_t *local_60;
  opj_tcd_resolution_t *local_58;
  OPJ_BYTE *local_50;
  OPJ_UINT32 *local_48;
  OPJ_BYTE *local_40;
  opj_tcd_t *local_38;
  
  local_88 = p_t2->image;
  poVar1 = p_t2->cp->tcps;
  OVar11 = poVar1[p_tile_no].numpocs;
  local_b0 = p_tile;
  local_68 = p_t2;
  local_48 = p_data_read;
  local_38 = tcd;
  poVar8 = opj_pi_create_decode(local_88,p_t2->cp,p_tile_no);
  if (poVar8 == (opj_pi_iterator_t *)0x0) {
LAB_00135cbe:
    OVar6 = 0;
  }
  else {
    local_c0 = (ulong)p_max_len;
    local_98 = poVar1 + p_tile_no;
    local_d4 = OVar11 + 1;
    uVar12 = 0;
    local_b8 = poVar8;
    local_a0 = p_src;
    local_40 = p_src;
    do {
      poVar5 = local_88;
      if (((poVar8->poc).prg == OPJ_PROG_UNKNOWN) ||
         (local_d0 = poVar8, local_6c = uVar12, __s = opj_malloc((ulong)local_88->numcomps << 2),
         __s == (void *)0x0)) {
        opj_pi_destroy(local_b8,local_d4);
        goto LAB_00135cbe;
      }
      local_a8 = __s;
      memset(__s,1,(ulong)poVar5->numcomps << 2);
      p_manager_00 = (opj_event_mgr_t *)0x135681;
      OVar6 = opj_pi_next(local_d0);
      poVar8 = local_d0;
      poVar31 = local_b0;
      if (OVar6 != 0) {
LAB_00135693:
        p_tile_00 = (opj_tcd_tile_t *)poVar31->comps;
        if (poVar8->layno < local_98->num_layers_to_decode) {
          uVar9 = (ulong)poVar8->resno;
          if (poVar8->resno < *(uint *)(p_tile_00->distolayer + (ulong)poVar8->compno * 0xe + -3)) {
            pOVar2 = (OPJ_INT32 *)p_tile_00->distolayer[(ulong)poVar8->compno * 0xe + -2];
            if (pOVar2[uVar9 * 0x30 + 6] != 0) {
              plVar30 = (long *)(pOVar2 + uVar9 * 0x30 + 0xe);
              uVar27 = 0;
LAB_001356e4:
              lVar3 = *plVar30;
              uVar14 = (ulong)poVar8->precno;
              uVar12 = *(uint *)(lVar3 + uVar14 * 0x38 + 0xc);
              p_manager_00 = (opj_event_mgr_t *)(ulong)uVar12;
              OVar6 = opj_tcd_is_subband_area_of_interest
                                (local_38,poVar8->compno,poVar8->resno,*(OPJ_UINT32 *)(plVar30 + -1)
                                 ,*(OPJ_UINT32 *)(lVar3 + uVar14 * 0x38),
                                 *(OPJ_UINT32 *)(lVar3 + uVar14 * 0x38 + 4),
                                 *(OPJ_UINT32 *)(lVar3 + uVar14 * 0x38 + 8),uVar12);
              poVar31 = local_b0;
              poVar8 = local_d0;
              if (OVar6 == 0) goto code_r0x00135726;
              *(undefined4 *)((long)local_a8 + (ulong)local_d0->compno * 4) = 0;
              local_d8 = 0;
              OVar6 = opj_t2_read_packet_header
                                ((opj_t2_t *)local_68->cp,(opj_tcd_tile_t *)local_b0->comps,local_98
                                 ,local_d0,&l_read_data,local_a0,&local_d8,(OPJ_UINT32)local_c0,
                                 (opj_packet_info_t *)p_manager,p_manager_00);
              OVar11 = local_d8;
              if (OVar6 != 0) {
                uVar9 = (ulong)local_d8;
                uVar12 = poVar8->compno;
                uVar18 = poVar8->resno;
                if (l_read_data != 0) {
                  pOVar16 = local_a0 + uVar9;
                  local_d8 = 0;
                  poVar23 = poVar31->comps[uVar12].resolutions;
                  uVar7 = poVar23[uVar18].numbands;
                  pOVar10 = pOVar16;
                  if (uVar7 != 0) {
                    poVar23 = poVar23 + uVar18;
                    poVar13 = poVar23->bands;
                    pOVar24 = pOVar16 + ((int)local_c0 - OVar11);
                    uVar12 = 0;
                    do {
                      if ((poVar13->x1 != poVar13->x0) && (poVar13->y1 != poVar13->y0)) {
                        uVar18 = poVar8->precno;
                        poVar4 = poVar13->precincts;
                        iVar22 = poVar4[uVar18].ch * poVar4[uVar18].cw;
                        if (iVar22 != 0) {
                          poVar25 = poVar4[uVar18].cblks.dec;
                          iVar15 = 0;
                          local_80 = CONCAT44(local_80._4_4_,iVar22);
                          local_90 = uVar9;
                          local_70 = uVar12;
                          local_60 = poVar13;
                          local_58 = poVar23;
                          local_50 = pOVar10;
                          do {
                            OVar11 = poVar25->numnewpasses;
                            if (OVar11 != 0) {
                              OVar20 = poVar25->numsegs;
                              poVar28 = poVar25->segs;
                              local_78 = CONCAT44(local_78._4_4_,iVar15);
                              if (OVar20 == 0) {
                                OVar20 = 1;
LAB_00135acb:
                                poVar25->numsegs = OVar20;
                              }
                              else {
                                poVar28 = poVar28 + (OVar20 - 1);
                                if (poVar28->numpasses == poVar28->maxpasses) {
                                  poVar28 = poVar28 + 1;
                                  OVar20 = OVar20 + 1;
                                  goto LAB_00135acb;
                                }
                              }
                              do {
                                OVar20 = poVar28->newlen;
                                uVar9 = (ulong)OVar20;
                                uVar27 = ~(ulong)pOVar16;
                                pOVar10 = pOVar16 + uVar9;
                                if (pOVar10 > pOVar24 || uVar9 > uVar27) {
                                  OVar20 = (int)pOVar24 - (int)pOVar16;
                                  poVar28->newlen = OVar20;
                                }
                                OVar19 = poVar25->numchunks;
                                ptr = poVar25->chunks;
                                OVar26 = OVar11;
                                if (OVar19 == poVar25->numchunksalloc) {
                                  uVar12 = OVar19 * 2 + 1;
                                  ptr = (opj_tcd_seg_data_chunk_t *)
                                        opj_realloc(ptr,(ulong)uVar12 << 4);
                                  if (ptr == (opj_tcd_seg_data_chunk_t *)0x0) {
                                    opj_event_msg(p_manager,1,
                                                  "cannot allocate opj_tcd_seg_data_chunk_t* array")
                                    ;
                                    goto LAB_00135ca6;
                                  }
                                  poVar25->chunks = ptr;
                                  poVar25->numchunksalloc = uVar12;
                                  OVar19 = poVar25->numchunks;
                                  OVar20 = poVar28->newlen;
                                  poVar8 = local_d0;
                                  OVar26 = poVar25->numnewpasses;
                                }
                                ptr[OVar19].data = pOVar16;
                                ptr[OVar19].len = OVar20;
                                poVar25->numchunks = OVar19 + 1;
                                poVar28->len = poVar28->len + OVar20;
                                OVar19 = poVar28->numnewpasses;
                                OVar21 = poVar28->numpasses + OVar19;
                                poVar28->numpasses = OVar21;
                                OVar11 = OVar26 - OVar19;
                                poVar25->numnewpasses = OVar11;
                                poVar28->real_num_passes = OVar21;
                                if (OVar11 != 0) {
                                  poVar28 = poVar28 + 1;
                                  poVar25->numsegs = poVar25->numsegs + 1;
                                }
                                pOVar16 = pOVar16 + OVar20;
                              } while ((pOVar10 <= pOVar24 && uVar9 <= uVar27) && OVar26 != OVar19);
                              poVar25->real_num_segs = poVar25->numsegs;
                              poVar31 = local_b0;
                              uVar9 = local_90;
                              iVar22 = (int)local_80;
                              iVar15 = (int)local_78;
                            }
                            poVar25 = poVar25 + 1;
                            iVar15 = iVar15 + 1;
                          } while (iVar15 != iVar22);
                          uVar7 = local_58->numbands;
                          poVar13 = local_60;
                          pOVar10 = local_50;
                          poVar23 = local_58;
                          uVar12 = local_70;
                        }
                      }
                      poVar13 = poVar13 + 1;
                      uVar12 = uVar12 + 1;
                    } while (uVar12 < uVar7);
                    uVar12 = poVar8->compno;
                    uVar18 = poVar8->resno;
                  }
                  uVar9 = (ulong)(uint)((int)uVar9 + ((int)pOVar16 - (int)pOVar10));
                }
                uVar27 = (ulong)uVar12;
                uVar12 = local_88->comps[uVar27].resno_decoded;
                if (uVar12 < uVar18) {
                  uVar12 = uVar18;
                }
                local_88->comps[uVar27].resno_decoded = uVar12;
                goto LAB_00135906;
              }
              goto LAB_00135ca6;
            }
          }
        }
        goto LAB_00135748;
      }
LAB_00135c33:
      poVar8 = poVar8 + 1;
      opj_free(local_a8);
      pOVar16 = local_40;
      uVar12 = local_6c + 1;
    } while (uVar12 <= local_98->numpocs);
    opj_pi_destroy(local_b8,local_d4);
    *local_48 = (int)local_a0 - (int)pOVar16;
    OVar6 = 1;
  }
  return OVar6;
code_r0x00135726:
  uVar27 = uVar27 + 1;
  plVar30 = plVar30 + 6;
  if ((uint)pOVar2[uVar9 * 0x30 + 6] <= uVar27) goto code_r0x0013573a;
  goto LAB_001356e4;
code_r0x0013573a:
  p_tile_00 = (opj_tcd_tile_t *)local_b0->comps;
LAB_00135748:
  local_d8 = 0;
  OVar6 = opj_t2_read_packet_header
                    ((opj_t2_t *)local_68->cp,p_tile_00,local_98,poVar8,&l_read_data,local_a0,
                     &local_d8,(OPJ_UINT32)local_c0,(opj_packet_info_t *)p_manager,p_manager_00);
  if (OVar6 == 0) {
LAB_00135ca6:
    opj_pi_destroy(local_b8,local_d4);
    opj_free(local_a8);
    goto LAB_00135cbe;
  }
  uVar27 = (ulong)poVar8->compno;
  uVar9 = (ulong)local_d8;
  if (l_read_data != 0) {
    poVar23 = poVar31->comps[uVar27].resolutions;
    OVar11 = poVar23[poVar8->resno].numbands;
    if (OVar11 == 0) {
      uVar12 = 0;
    }
    else {
      uVar18 = (int)local_c0 - local_d8;
      poVar13 = poVar23[poVar8->resno].bands;
      uVar9 = (ulong)poVar8->precno;
      uVar12 = 0;
      local_78 = uVar9 * 0x38;
      OVar20 = 0;
      do {
        if ((poVar13->x1 != poVar13->x0) && (poVar13->y1 != poVar13->y0)) {
          poVar4 = poVar13->precincts;
          iVar22 = poVar4[uVar9].ch * poVar4[uVar9].cw;
          if (iVar22 != 0) {
            poVar25 = poVar4[uVar9].cblks.dec;
            iVar15 = 0;
            do {
              OVar19 = poVar25->numnewpasses;
              if (OVar19 != 0) {
                OVar26 = poVar25->numsegs;
                poVar28 = poVar25->segs;
                uVar7 = uVar12;
                if (OVar26 == 0) {
                  OVar26 = 1;
LAB_00135868:
                  poVar25->numsegs = OVar26;
                }
                else {
                  poVar28 = poVar28 + (OVar26 - 1);
                  if (poVar28->numpasses == poVar28->maxpasses) {
                    poVar28 = poVar28 + 1;
                    OVar26 = OVar26 + 1;
                    goto LAB_00135868;
                  }
                }
                do {
                  uVar29 = poVar28->newlen + uVar7;
                  bVar32 = uVar7 <= uVar29;
                  uVar12 = uVar29;
                  if (uVar29 > uVar18 || !bVar32) {
                    poVar28->newlen = uVar18 - uVar7;
                    uVar12 = uVar18;
                  }
                  OVar21 = poVar28->numnewpasses;
                  poVar28->numpasses = poVar28->numpasses + OVar21;
                  OVar17 = OVar19 - OVar21;
                  if (OVar17 != 0) {
                    poVar28 = poVar28 + 1;
                    OVar26 = OVar26 + 1;
                    poVar25->numsegs = OVar26;
                  }
                  bVar33 = OVar19 != OVar21;
                  OVar19 = OVar17;
                  uVar7 = uVar12;
                } while ((uVar29 <= uVar18 && bVar32) && bVar33);
                poVar25->numnewpasses = OVar17;
              }
              poVar25 = poVar25 + 1;
              iVar15 = iVar15 + 1;
            } while (iVar15 != iVar22);
          }
        }
        poVar13 = poVar13 + 1;
        OVar20 = OVar20 + 1;
      } while (OVar20 != OVar11);
    }
    uVar9 = (ulong)(local_d8 + uVar12);
    poVar8 = local_d0;
    poVar31 = local_b0;
    local_90 = (ulong)local_d8;
    local_80 = uVar27;
  }
LAB_00135906:
  if (*(int *)((long)local_a8 + uVar27 * 4) != 0) {
    if (local_88->comps[uVar27].resno_decoded == 0) {
      local_88->comps[uVar27].resno_decoded = poVar31->comps[uVar27].minimum_num_resolutions - 1;
    }
  }
  local_a0 = local_a0 + uVar9;
  local_c0 = (ulong)(uint)((int)local_c0 - (int)uVar9);
  p_manager_00 = (opj_event_mgr_t *)0x13595b;
  OVar6 = opj_pi_next(poVar8);
  if (OVar6 == 0) goto LAB_00135c33;
  goto LAB_00135693;
}

Assistant:

OPJ_BOOL opj_t2_decode_packets(opj_tcd_t* tcd,
                               opj_t2_t *p_t2,
                               OPJ_UINT32 p_tile_no,
                               opj_tcd_tile_t *p_tile,
                               OPJ_BYTE *p_src,
                               OPJ_UINT32 * p_data_read,
                               OPJ_UINT32 p_max_len,
                               opj_codestream_index_t *p_cstr_index,
                               opj_event_mgr_t *p_manager)
{
    OPJ_BYTE *l_current_data = p_src;
    opj_pi_iterator_t *l_pi = 00;
    OPJ_UINT32 pino;
    opj_image_t *l_image = p_t2->image;
    opj_cp_t *l_cp = p_t2->cp;
    opj_tcp_t *l_tcp = &(p_t2->cp->tcps[p_tile_no]);
    OPJ_UINT32 l_nb_bytes_read;
    OPJ_UINT32 l_nb_pocs = l_tcp->numpocs + 1;
    opj_pi_iterator_t *l_current_pi = 00;
#ifdef TODO_MSD
    OPJ_UINT32 curtp = 0;
    OPJ_UINT32 tp_start_packno;
#endif
    opj_packet_info_t *l_pack_info = 00;
    opj_image_comp_t* l_img_comp = 00;

    OPJ_ARG_NOT_USED(p_cstr_index);

#ifdef TODO_MSD
    if (p_cstr_index) {
        l_pack_info = p_cstr_index->tile_index[p_tile_no].packet;
    }
#endif

    /* create a packet iterator */
    l_pi = opj_pi_create_decode(l_image, l_cp, p_tile_no);
    if (!l_pi) {
        return OPJ_FALSE;
    }


    l_current_pi = l_pi;

    for (pino = 0; pino <= l_tcp->numpocs; ++pino) {

        /* if the resolution needed is too low, one dim of the tilec could be equal to zero
         * and no packets are used to decode this resolution and
         * l_current_pi->resno is always >= p_tile->comps[l_current_pi->compno].minimum_num_resolutions
         * and no l_img_comp->resno_decoded are computed
         */
        OPJ_BOOL* first_pass_failed = NULL;

        if (l_current_pi->poc.prg == OPJ_PROG_UNKNOWN) {
            /* TODO ADE : add an error */
            opj_pi_destroy(l_pi, l_nb_pocs);
            return OPJ_FALSE;
        }

        first_pass_failed = (OPJ_BOOL*)opj_malloc(l_image->numcomps * sizeof(OPJ_BOOL));
        if (!first_pass_failed) {
            opj_pi_destroy(l_pi, l_nb_pocs);
            return OPJ_FALSE;
        }
        memset(first_pass_failed, OPJ_TRUE, l_image->numcomps * sizeof(OPJ_BOOL));

        while (opj_pi_next(l_current_pi)) {
            OPJ_BOOL skip_packet = OPJ_FALSE;
            JAS_FPRINTF(stderr,
                        "packet offset=00000166 prg=%d cmptno=%02d rlvlno=%02d prcno=%03d lyrno=%02d\n\n",
                        l_current_pi->poc.prg1, l_current_pi->compno, l_current_pi->resno,
                        l_current_pi->precno, l_current_pi->layno);

            /* If the packet layer is greater or equal than the maximum */
            /* number of layers, skip the packet */
            if (l_current_pi->layno >= l_tcp->num_layers_to_decode) {
                skip_packet = OPJ_TRUE;
            }
            /* If the packet resolution number is greater than the minimum */
            /* number of resolution allowed, skip the packet */
            else if (l_current_pi->resno >=
                     p_tile->comps[l_current_pi->compno].minimum_num_resolutions) {
                skip_packet = OPJ_TRUE;
            } else {
                /* If no precincts of any band intersects the area of interest, */
                /* skip the packet */
                OPJ_UINT32 bandno;
                opj_tcd_tilecomp_t *tilec = &p_tile->comps[l_current_pi->compno];
                opj_tcd_resolution_t *res = &tilec->resolutions[l_current_pi->resno];

                skip_packet = OPJ_TRUE;
                for (bandno = 0; bandno < res->numbands; ++bandno) {
                    opj_tcd_band_t* band = &res->bands[bandno];
                    opj_tcd_precinct_t* prec = &band->precincts[l_current_pi->precno];

                    if (opj_tcd_is_subband_area_of_interest(tcd,
                                                            l_current_pi->compno,
                                                            l_current_pi->resno,
                                                            band->bandno,
                                                            (OPJ_UINT32)prec->x0,
                                                            (OPJ_UINT32)prec->y0,
                                                            (OPJ_UINT32)prec->x1,
                                                            (OPJ_UINT32)prec->y1)) {
                        skip_packet = OPJ_FALSE;
                        break;
                    }
                }
                /*
                                printf("packet cmptno=%02d rlvlno=%02d prcno=%03d lyrno=%02d -> %s\n",
                                    l_current_pi->compno, l_current_pi->resno,
                                    l_current_pi->precno, l_current_pi->layno, skip_packet ? "skipped" : "kept");
                */
            }

            if (!skip_packet) {
                l_nb_bytes_read = 0;

                first_pass_failed[l_current_pi->compno] = OPJ_FALSE;

                if (! opj_t2_decode_packet(p_t2, p_tile, l_tcp, l_current_pi, l_current_data,
                                           &l_nb_bytes_read, p_max_len, l_pack_info, p_manager)) {
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    opj_free(first_pass_failed);
                    return OPJ_FALSE;
                }

                l_img_comp = &(l_image->comps[l_current_pi->compno]);
                l_img_comp->resno_decoded = opj_uint_max(l_current_pi->resno,
                                            l_img_comp->resno_decoded);
            } else {
                l_nb_bytes_read = 0;
                if (! opj_t2_skip_packet(p_t2, p_tile, l_tcp, l_current_pi, l_current_data,
                                         &l_nb_bytes_read, p_max_len, l_pack_info, p_manager)) {
                    opj_pi_destroy(l_pi, l_nb_pocs);
                    opj_free(first_pass_failed);
                    return OPJ_FALSE;
                }
            }

            if (first_pass_failed[l_current_pi->compno]) {
                l_img_comp = &(l_image->comps[l_current_pi->compno]);
                if (l_img_comp->resno_decoded == 0) {
                    l_img_comp->resno_decoded =
                        p_tile->comps[l_current_pi->compno].minimum_num_resolutions - 1;
                }
            }

            l_current_data += l_nb_bytes_read;
            p_max_len -= l_nb_bytes_read;

            /* INDEX >> */
#ifdef TODO_MSD
            if (p_cstr_info) {
                opj_tile_info_v2_t *info_TL = &p_cstr_info->tile[p_tile_no];
                opj_packet_info_t *info_PK = &info_TL->packet[p_cstr_info->packno];
                tp_start_packno = 0;
                if (!p_cstr_info->packno) {
                    info_PK->start_pos = info_TL->end_header + 1;
                } else if (info_TL->packet[p_cstr_info->packno - 1].end_pos >=
                           (OPJ_INT32)
                           p_cstr_info->tile[p_tile_no].tp[curtp].tp_end_pos) { /* New tile part */
                    info_TL->tp[curtp].tp_numpacks = p_cstr_info->packno -
                                                     tp_start_packno; /* Number of packets in previous tile-part */
                    tp_start_packno = p_cstr_info->packno;
                    curtp++;
                    info_PK->start_pos = p_cstr_info->tile[p_tile_no].tp[curtp].tp_end_header + 1;
                } else {
                    info_PK->start_pos = (l_cp->m_specific_param.m_enc.m_tp_on &&
                                          info_PK->start_pos) ? info_PK->start_pos : info_TL->packet[p_cstr_info->packno -
                                                                      1].end_pos + 1;
                }
                info_PK->end_pos = info_PK->start_pos + l_nb_bytes_read - 1;
                info_PK->end_ph_pos += info_PK->start_pos -
                                       1;  /* End of packet header which now only represents the distance */
                ++p_cstr_info->packno;
            }
#endif
            /* << INDEX */
        }
        ++l_current_pi;

        opj_free(first_pass_failed);
    }
    /* INDEX >> */
#ifdef TODO_MSD
    if
    (p_cstr_info) {
        p_cstr_info->tile[p_tile_no].tp[curtp].tp_numpacks = p_cstr_info->packno -
                tp_start_packno; /* Number of packets in last tile-part */
    }
#endif
    /* << INDEX */

    /* don't forget to release pi */
    opj_pi_destroy(l_pi, l_nb_pocs);
    *p_data_read = (OPJ_UINT32)(l_current_data - p_src);
    return OPJ_TRUE;
}